

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O3

void __thiscall
QScrollBarPrivate::activateControl(QScrollBarPrivate *this,uint control,int threshold)

{
  SliderAction action;
  
  action = SliderPageStepAdd;
  switch(control) {
  case 1:
  case 2:
    action = control;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    return;
  case 4:
    break;
  case 8:
    action = SliderPageStepSub;
    break;
  default:
    if (control == 0x10) {
      action = SliderToMinimum;
    }
    else {
      if (control != 0x20) {
        return;
      }
      action = SliderToMaximum;
    }
  }
  QAbstractSlider::setRepeatAction
            (*(QAbstractSlider **)
              &(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x8,action,threshold,
             0x32);
  QAbstractSlider::triggerAction
            (*(QAbstractSlider **)
              &(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x8,action);
  return;
}

Assistant:

void QScrollBarPrivate::activateControl(uint control, int threshold)
{
    QAbstractSlider::SliderAction action = QAbstractSlider::SliderNoAction;
    switch (control) {
    case QStyle::SC_ScrollBarAddPage:
        action = QAbstractSlider::SliderPageStepAdd;
        break;
    case QStyle::SC_ScrollBarSubPage:
        action = QAbstractSlider::SliderPageStepSub;
        break;
    case QStyle::SC_ScrollBarAddLine:
        action = QAbstractSlider::SliderSingleStepAdd;
        break;
    case QStyle::SC_ScrollBarSubLine:
        action = QAbstractSlider::SliderSingleStepSub;
        break;
    case QStyle::SC_ScrollBarFirst:
        action = QAbstractSlider::SliderToMinimum;
        break;
    case QStyle::SC_ScrollBarLast:
        action = QAbstractSlider::SliderToMaximum;
        break;
    default:
        break;
    }

    if (action) {
        q_func()->setRepeatAction(action, threshold);
        q_func()->triggerAction(action);
    }
}